

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_create(uchar **out,size_t *outsize,size_t length,char *type,uchar *data)

{
  uint uVar1;
  undefined1 auStack_48 [4];
  uint error;
  ucvector v;
  uchar *data_local;
  char *type_local;
  size_t length_local;
  size_t *outsize_local;
  uchar **out_local;
  
  v.allocsize = (size_t)data;
  ucvector_init((ucvector *)auStack_48,*out,*outsize);
  uVar1 = lodepng_chunk_createv((ucvector *)auStack_48,length,type,(uchar *)v.allocsize);
  *out = _auStack_48;
  *outsize = (size_t)v.data;
  return uVar1;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outsize,
                              size_t length, const char* type, const unsigned char* data) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_chunk_createv(&v, length, type, data);
  *out = v.data;
  *outsize = v.size;
  return error;
}